

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt1.cpp
# Opt level: O0

void __thiscall crnlib::qdxt1::optimize_selectors_task(qdxt1 *this,uint64 data,void *pData_ptr)

{
  uint *this_00;
  uint uVar1;
  dxt_pixel_block *pdVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  crn_thread_id_t cVar6;
  uint *puVar7;
  dxt1_block *pdVar8;
  vector<unsigned_int> *local_240;
  color_quad<unsigned_char,_int> *local_1f0;
  vector<unsigned_int> *local_138;
  dxt1_block *dst_block_1;
  uint local_120;
  uint block_index_2;
  uint block_iter_2;
  uint error;
  color_quad_u8 colors [4];
  dxt1_block *dst_block;
  color_quad_u8 *orig_color;
  uint block_index_1;
  uint block_iter_1;
  uint64 total_error;
  uint s;
  uint max_s;
  uint64 best_error;
  uint local_c8;
  uint best_s;
  uint x;
  uint y;
  vector<unsigned_int> *block_indices;
  uint block_type;
  dxt1_block blk;
  color_quad_u8 *src;
  uint i;
  color_quad_u8 *pSrc_pixels;
  bool has_alpha_pixels;
  dxt1_block *src_block;
  uint block_index;
  uint block_iter;
  vector<unsigned_int> *selector_indices;
  uint local_68;
  uint cluster_index;
  undefined1 local_58 [8];
  vector<unsigned_int> block_categories [2];
  optimize_selectors_params *task_params;
  uint thread_index;
  void *pData_ptr_local;
  uint64 data_local;
  qdxt1 *this_local;
  
  local_138 = (vector<unsigned_int> *)local_58;
  do {
    vector<unsigned_int>::vector(local_138);
    local_138 = local_138 + 1;
  } while (local_138 != (vector<unsigned_int> *)&block_categories[1].m_size);
  vector<unsigned_int>::reserve((vector<unsigned_int> *)local_58,0x800);
  vector<unsigned_int>::reserve((vector<unsigned_int> *)&block_categories[0].m_size,0x800);
  local_68 = 0;
  do {
    uVar1 = local_68;
    uVar4 = vector<crnlib::vector<unsigned_int>_>::size(*pData_ptr);
    if (uVar4 <= uVar1) {
      selector_indices._4_4_ = 0;
LAB_0015a12f:
      local_240 = (vector<unsigned_int> *)&block_categories[1].m_size;
      do {
        local_240 = local_240 + -1;
        vector<unsigned_int>::~vector(local_240);
      } while (local_240 != (vector<unsigned_int> *)local_58);
      return;
    }
    if ((this->m_canceled & 1U) != 0) {
      selector_indices._4_4_ = 1;
      goto LAB_0015a12f;
    }
    if (((local_68 & 0xff) == 0) &&
       (cVar6 = crn_get_current_thread_id(), uVar1 = local_68, cVar6 == this->m_main_thread_id)) {
      uVar4 = vector<crnlib::vector<unsigned_int>_>::size(*pData_ptr);
      bVar3 = update_progress(this,uVar1,uVar4 - 1);
      if (!bVar3) {
        selector_indices._4_4_ = 1;
        goto LAB_0015a12f;
      }
    }
    uVar4 = task_pool::get_num_threads(this->m_pTask_pool);
    uVar1 = local_68;
    if ((uVar4 == 0) ||
       (uVar4 = task_pool::get_num_threads(this->m_pTask_pool), uVar1 % (uVar4 + 1) == (uint)data))
    {
      _block_index = vector<crnlib::vector<unsigned_int>_>::operator[](*pData_ptr,local_68);
      uVar4 = vector<unsigned_int>::size(_block_index);
      if (1 < uVar4) {
        vector<unsigned_int>::resize((vector<unsigned_int> *)local_58,0,false);
        vector<unsigned_int>::resize((vector<unsigned_int> *)&block_categories[0].m_size,0,false);
        for (src_block._4_4_ = 0; uVar1 = src_block._4_4_,
            uVar4 = vector<unsigned_int>::size(_block_index), uVar1 < uVar4;
            src_block._4_4_ = src_block._4_4_ + 1) {
          puVar7 = vector<unsigned_int>::operator[](_block_index,src_block._4_4_);
          src_block._0_4_ = *puVar7;
          pdVar8 = get_block(this,(uint)src_block);
          bVar3 = dxt1_block::is_alpha_block(pdVar8);
          if (bVar3) {
            bVar3 = false;
            if ((this->m_params).m_dxt1a_alpha_threshold != 0) {
              for (src._4_4_ = 0; src._4_4_ < 0x10; src._4_4_ = src._4_4_ + 1) {
                blk = (dxt1_block)(this->m_pBlocks[(uint)src_block].m_pixels[0] + src._4_4_);
                if ((uint)*(byte *)((long)blk + 3) < (this->m_params).m_dxt1a_alpha_threshold) {
                  bVar3 = true;
                  break;
                }
              }
            }
            if (!bVar3) {
              vector<unsigned_int>::push_back
                        ((vector<unsigned_int> *)&block_categories[0].m_size,(uint *)&src_block);
            }
          }
          else {
            vector<unsigned_int>::push_back((vector<unsigned_int> *)local_58,(uint *)&src_block);
          }
        }
        utils::zero_object<crnlib::dxt1_block>((dxt1_block *)&stack0xffffffffffffff50);
        for (block_indices._4_4_ = 0; block_indices._4_4_ < 2;
            block_indices._4_4_ = block_indices._4_4_ + 1) {
          this_00 = &block_categories[(ulong)block_indices._4_4_ - 1].m_size;
          uVar4 = vector<unsigned_int>::size((vector<unsigned_int> *)this_00);
          if (1 < uVar4) {
            for (best_s = 0; best_s < 4; best_s = best_s + 1) {
              for (local_c8 = 0; local_c8 < 4; local_c8 = local_c8 + 1) {
                best_error._4_4_ = 0;
                _s = 0xffffffffff;
                total_error._4_4_ = 4;
                if (block_indices._4_4_ == 1) {
                  total_error._4_4_ = 3;
                }
                for (total_error._0_4_ = 0; (uint)total_error < total_error._4_4_;
                    total_error._0_4_ = (uint)total_error + 1) {
                  _block_index_1 = 0;
                  for (orig_color._4_4_ = 0;
                      uVar4 = vector<unsigned_int>::size((vector<unsigned_int> *)this_00),
                      orig_color._4_4_ < uVar4; orig_color._4_4_ = orig_color._4_4_ + 1) {
                    puVar7 = vector<unsigned_int>::operator[]
                                       ((vector<unsigned_int> *)this_00,orig_color._4_4_);
                    uVar1 = *puVar7;
                    pdVar2 = this->m_pBlocks;
                    pdVar8 = get_block(this,uVar1);
                    local_1f0 = (color_quad<unsigned_char,_int> *)&block_iter_2;
                    do {
                      color_quad<unsigned_char,_int>::color_quad(local_1f0);
                      local_1f0 = local_1f0 + 1;
                    } while (local_1f0 != colors + 2);
                    uVar4 = dxt1_block::get_low_color(pdVar8);
                    uVar5 = dxt1_block::get_high_color(pdVar8);
                    dxt1_block::get_block_colors
                              ((color_quad_u8 *)&block_iter_2,(uint16)uVar4,(uint16)uVar5);
                    uVar4 = crnlib::color::color_distance
                                      ((bool)((this->m_params).m_perceptual & 1),
                                       pdVar2[uVar1].m_pixels[best_s] + local_c8,
                                       (color_quad_u8 *)(&block_iter_2 + (uint)total_error),false);
                    _block_index_1 = uVar4 + _block_index_1;
                  }
                  if (_block_index_1 < _s) {
                    _s = _block_index_1;
                    best_error._4_4_ = (uint)total_error;
                  }
                }
                dxt1_block::set_selector
                          ((dxt1_block *)&stack0xffffffffffffff50,local_c8,best_s,best_error._4_4_);
              }
            }
            for (local_120 = 0; uVar4 = vector<unsigned_int>::size((vector<unsigned_int> *)this_00),
                local_120 < uVar4; local_120 = local_120 + 1) {
              puVar7 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)this_00,local_120);
              pdVar8 = get_block(this,*puVar7);
              *(uint *)pdVar8->m_selectors = block_type;
            }
          }
        }
      }
    }
    local_68 = local_68 + 1;
  } while( true );
}

Assistant:

void qdxt1::optimize_selectors_task(uint64 data, void* pData_ptr)
    {
        const uint thread_index = static_cast<uint>(data);

        optimize_selectors_params& task_params = *static_cast<optimize_selectors_params*>(pData_ptr);

        crnlib::vector<uint> block_categories[2];
        block_categories[0].reserve(2048);
        block_categories[1].reserve(2048);

        for (uint cluster_index = 0; cluster_index < task_params.m_selector_cluster_indices.size(); cluster_index++)
        {
            if (m_canceled)
            {
                return;
            }

            if ((cluster_index & 255) == 0)
            {
                if (crn_get_current_thread_id() == m_main_thread_id)
                {
                    if (!update_progress(cluster_index, task_params.m_selector_cluster_indices.size() - 1))
                    {
                        return;
                    }
                }
            }

            if (m_pTask_pool->get_num_threads())
            {
                if ((cluster_index % (m_pTask_pool->get_num_threads() + 1)) != thread_index)
                {
                    continue;
                }
            }

            const crnlib::vector<uint>& selector_indices = task_params.m_selector_cluster_indices[cluster_index];

            if (selector_indices.size() <= 1)
            {
                continue;
            }

            block_categories[0].resize(0);
            block_categories[1].resize(0);

            for (uint block_iter = 0; block_iter < selector_indices.size(); block_iter++)
            {
                const uint block_index = selector_indices[block_iter];

                const dxt1_block& src_block = get_block(block_index);

                if (!src_block.is_alpha_block())
                {
                    block_categories[0].push_back(block_index);
                }
                else
                {
                    bool has_alpha_pixels = false;

                    if (m_params.m_dxt1a_alpha_threshold > 0)
                    {
                        const color_quad_u8* pSrc_pixels = (const color_quad_u8*)m_pBlocks[block_index].m_pixels;

                        for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
                        {
                            const color_quad_u8& src = pSrc_pixels[i];
                            if (src.a < m_params.m_dxt1a_alpha_threshold)
                            {
                                has_alpha_pixels = true;
                                break;
                            }
                        }
                    }

                    if (has_alpha_pixels)
                    {
                        continue;
                    }

                    block_categories[1].push_back(block_index);
                }
            }

            dxt1_block blk;
            utils::zero_object(blk);

            for (uint block_type = 0; block_type <= 1; block_type++)
            {
                const crnlib::vector<uint>& block_indices = block_categories[block_type];
                if (block_indices.size() <= 1)
                {
                    continue;
                }

                for (uint y = 0; y < 4; y++)
                {
                    for (uint x = 0; x < 4; x++)
                    {
                        uint best_s = 0;
                        uint64 best_error = 0xFFFFFFFFFFULL;

                        uint max_s = 4;
                        if (block_type == 1)
                        {
                            max_s = 3;
                        }

                        for (uint s = 0; s < max_s; s++)
                        {
                            uint64 total_error = 0;

                            for (uint block_iter = 0; block_iter < block_indices.size(); block_iter++)
                            {
                                const uint block_index = block_indices[block_iter];

                                const color_quad_u8& orig_color = m_pBlocks[block_index].m_pixels[y][x];

                                const dxt1_block& dst_block = get_block(block_index);

                                color_quad_u8 colors[4];
                                dxt1_block::get_block_colors(colors, static_cast<uint16>(dst_block.get_low_color()), static_cast<uint16>(dst_block.get_high_color()));

                                uint error = color::color_distance(m_params.m_perceptual, orig_color, colors[s], false);

                                total_error += error;
                            }

                            if (total_error < best_error)
                            {
                                best_error = total_error;
                                best_s = s;
                            }
                        }

                        blk.set_selector(x, y, best_s);

                    } // x
                } // y

                for (uint block_iter = 0; block_iter < block_indices.size(); block_iter++)
                {
                    const uint block_index = block_indices[block_iter];

                    dxt1_block& dst_block = get_block(block_index);

                    memcpy(dst_block.m_selectors, blk.m_selectors, sizeof(dst_block.m_selectors));
                }
            }

        } // cluster_index
    }